

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::Array<capnp::(anonymous_namespace)::CapnpcCppMain::MethodText>::~Array
          (Array<capnp::(anonymous_namespace)::CapnpcCppMain::MethodText> *this)

{
  Array<capnp::(anonymous_namespace)::CapnpcCppMain::MethodText> *this_local;
  
  dispose(this);
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }